

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

bool trt_pose::parse::munkresStep2(PairGraph *star_graph,CoverTable *cover_table)

{
  bool bVar1;
  int local_28;
  int local_24;
  int local_20;
  int j;
  int count;
  int k;
  CoverTable *cover_table_local;
  PairGraph *star_graph_local;
  
  if (star_graph->nrows < star_graph->ncols) {
    local_28 = star_graph->nrows;
  }
  else {
    local_28 = star_graph->ncols;
  }
  local_20 = 0;
  for (local_24 = 0; local_24 < star_graph->ncols; local_24 = local_24 + 1) {
    bVar1 = utils::PairGraph::isColSet(star_graph,local_24);
    if (bVar1) {
      utils::CoverTable::coverCol(cover_table,local_24);
      local_20 = local_20 + 1;
    }
  }
  return local_28 <= local_20;
}

Assistant:

bool munkresStep2(const PairGraph &star_graph, CoverTable &cover_table) {
  int k =
      star_graph.nrows < star_graph.ncols ? star_graph.nrows : star_graph.ncols;
  int count = 0;
  for (int j = 0; j < star_graph.ncols; j++) {
    if (star_graph.isColSet(j)) {
      cover_table.coverCol(j);
      count++;
    }
  }
  return count >= k;
}